

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsstyle.cpp
# Opt level: O2

QSize __thiscall
QWindowsStyle::sizeFromContents
          (QWindowsStyle *this,ContentsType ct,QStyleOption *opt,QSize *csz,QWidget *widget)

{
  qreal qVar1;
  qreal qVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  undefined4 uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  QStyleOptionButton *pQVar10;
  QStyleOptionMenuItem *pQVar11;
  QSize QVar12;
  QStyleOptionToolButton *pQVar13;
  QSize QVar14;
  QStyle *pQVar15;
  int extraout_var;
  QSize QVar16;
  Representation RVar17;
  ulong uVar18;
  Representation RVar19;
  long in_FS_OFFSET;
  QFontMetrics fmBold;
  QFontMetrics fm;
  undefined8 local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (CT_MenuBarItem < ct) goto switchD_0038a543_caseD_1;
  QVar14 = *csz;
  uVar18 = (ulong)QVar14 >> 0x20;
  RVar19 = QVar14.wd.m_i;
  switch(ct) {
  case CT_PushButton:
    pQVar10 = qstyleoption_cast<QStyleOptionButton_const*>(opt);
    if (pQVar10 != (QStyleOptionButton *)0x0) {
      iVar5 = 0;
      QVar12 = QCommonStyle::sizeFromContents
                         (&this->super_QCommonStyle,CT_PushButton,opt,csz,widget);
      if (((pQVar10->features).super_QFlagsStorageHelper<QStyleOptionButton::ButtonFeature,_4>.
           super_QFlagsStorage<QStyleOptionButton::ButtonFeature>.i & 8) != 0) {
        pQVar15 = QStyle::proxy((QStyle *)QVar12);
        iVar5 = (**(code **)(*(long *)pQVar15 + 0xe0))(pQVar15,1,pQVar10,widget);
        iVar5 = iVar5 * 2;
      }
      qVar1 = QStyleHelper::dpi(opt);
      qVar2 = QStyleHelper::dpiScaled(75.0,qVar1);
      qVar1 = QStyleHelper::dpiScaled(23.0,qVar1);
      QVar14 = QVar12;
      if (QVar12.wd.m_i.m_i < (int)qVar2 + iVar5) {
        RVar19.m_i = (int)qVar2 + iVar5;
        if ((pQVar10->text).d.size == 0) {
          RVar19.m_i = QVar12.wd.m_i.m_i;
        }
        QVar14.ht.m_i = 0;
        QVar14.wd.m_i = RVar19.m_i;
      }
      uVar18 = (ulong)(uint)(iVar5 + (int)qVar1);
      if (iVar5 + (int)qVar1 <= QVar12.ht.m_i.m_i) {
        uVar18 = (ulong)QVar12 >> 0x20;
      }
    }
    break;
  case CT_ToolButton:
    pQVar13 = qstyleoption_cast<QStyleOptionToolButton_const*>(opt);
    if (pQVar13 != (QStyleOptionToolButton *)0x0) {
      QVar14 = (QSize)(((ulong)(RVar19.m_i + 7) | (ulong)QVar14 & 0xffffffff00000000) + 0x600000000)
      ;
      goto LAB_0038a869;
    }
  default:
switchD_0038a543_caseD_1:
    QVar14 = QCommonStyle::sizeFromContents(&this->super_QCommonStyle,ct,opt,csz,widget);
    uVar18 = (ulong)QVar14 >> 0x20;
    break;
  case CT_MenuItem:
    pQVar11 = qstyleoption_cast<QStyleOptionMenuItem_const*>(opt);
    if (pQVar11 != (QStyleOptionMenuItem *)0x0) {
      QVar12 = QCommonStyle::sizeFromContents(&this->super_QCommonStyle,CT_MenuItem,opt,csz,widget);
      if (pQVar11->menuItemType == Separator) {
        uVar18 = 9;
        QVar16 = QVar14;
      }
      else {
        cVar3 = QIcon::isNull();
        QVar16.wd.m_i = RVar19.m_i - 6;
        uVar18 = (ulong)(QVar12.ht.m_i.m_i - 2);
        if (cVar3 == '\0') {
          uVar18 = (ulong)QVar12 >> 0x20;
        }
        QVar16.ht.m_i = 0;
        if (cVar3 == '\0') {
          QVar16 = (QSize)((ulong)QVar14 & 0xffffffff);
        }
        if ((pQVar11->menuItemType != Separator) &&
           (pQVar15 = (QStyle *)QIcon::isNull(), (char)pQVar15 == '\0')) {
          pQVar15 = QStyle::proxy(pQVar15);
          uVar6 = (**(code **)(*(long *)pQVar15 + 0xe0))(pQVar15,0x3e,opt,widget);
          local_48 = (undefined1 *)CONCAT44(uVar6,uVar6);
          QIcon::actualSize((QSize *)&pQVar11->icon,(Mode)&local_48,On);
          uVar7 = extraout_var + 4U;
          if ((int)(extraout_var + 4U) < (int)(uint)uVar18) {
            uVar7 = (uint)uVar18;
          }
          uVar18 = (ulong)uVar7;
        }
      }
      iVar5 = pQVar11->maxIconWidth;
      bVar4 = QString::contains(&pQVar11->text,(QChar)0x9,CaseSensitive);
      RVar19 = QVar16.wd.m_i;
      if (bVar4) {
        RVar19.m_i = RVar19.m_i + 0x14;
      }
      else if (pQVar11->menuItemType == DefaultItem) {
        _fm = &DAT_aaaaaaaaaaaaaaaa;
        QFontMetrics::QFontMetrics(&fm,&pQVar11->font);
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
        QFont::QFont((QFont *)&local_48,&pQVar11->font);
        QFont::setWeight((Weight)(QFont *)&local_48);
        _fmBold = &DAT_aaaaaaaaaaaaaaaa;
        QFontMetrics::QFontMetrics(&fmBold,(QFont *)&local_48);
        iVar9 = (int)&pQVar11->text;
        iVar8 = QFontMetrics::horizontalAdvance((QString *)&fmBold,iVar9);
        iVar9 = QFontMetrics::horizontalAdvance((QString *)&fm,iVar9);
        RVar19.m_i = (iVar8 + RVar19.m_i) - iVar9;
        QFontMetrics::~QFontMetrics(&fmBold);
        QFont::~QFont((QFont *)&local_48);
        QFontMetrics::~QFontMetrics(&fm);
      }
      else if (pQVar11->menuItemType == SubMenu) {
        RVar19.m_i = RVar19.m_i + 0xc;
      }
      iVar8 = 0xc;
      if (0xc < iVar5) {
        iVar8 = iVar5;
      }
      QVar14.wd.m_i = RVar19.m_i + iVar8 + 0x19;
      QVar14.ht.m_i = 0;
    }
    break;
  case CT_MenuBarItem:
    RVar17 = QVar14.ht.m_i;
    if (0 < RVar17.m_i && 0 < RVar19.m_i) {
      QVar14.wd.m_i = RVar19.m_i + 0xc;
      QVar14.ht.m_i = 0;
      uVar18 = (ulong)(RVar17.m_i + 4);
    }
  }
  QVar14 = (QSize)((ulong)QVar14 & 0xffffffff | uVar18 << 0x20);
LAB_0038a869:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return QVar14;
}

Assistant:

QSize QWindowsStyle::sizeFromContents(ContentsType ct, const QStyleOption *opt,
                                      const QSize &csz, const QWidget *widget) const
{
    QSize sz(csz);
    switch (ct) {
    case CT_PushButton:
        if (const QStyleOptionButton *btn = qstyleoption_cast<const QStyleOptionButton *>(opt)) {
            sz = QCommonStyle::sizeFromContents(ct, opt, csz, widget);
            int w = sz.width(),
                h = sz.height();
            int defwidth = 0;
            if (btn->features & QStyleOptionButton::AutoDefaultButton)
                defwidth = 2 * proxy()->pixelMetric(PM_ButtonDefaultIndicator, btn, widget);
            const qreal dpi = QStyleHelper::dpi(opt);
            int minwidth = int(QStyleHelper::dpiScaled(75, dpi));
            int minheight = int(QStyleHelper::dpiScaled(23, dpi));

            if (w < minwidth + defwidth && !btn->text.isEmpty())
                w = minwidth + defwidth;
            if (h < minheight + defwidth)
                h = minheight + defwidth;

            sz = QSize(w, h);
        }
        break;
#if QT_CONFIG(menu)
    case CT_MenuItem:
        if (const QStyleOptionMenuItem *mi = qstyleoption_cast<const QStyleOptionMenuItem *>(opt)) {
            int w = sz.width();
            sz = QCommonStyle::sizeFromContents(ct, opt, csz, widget);

            if (mi->menuItemType == QStyleOptionMenuItem::Separator) {
                sz = QSize(10, QWindowsStylePrivate::windowsSepHeight);
            }
            else if (mi->icon.isNull()) {
                sz.setHeight(sz.height() - 2);
                w -= 6;
            }

            if (mi->menuItemType != QStyleOptionMenuItem::Separator && !mi->icon.isNull()) {
                int iconExtent = proxy()->pixelMetric(PM_SmallIconSize, opt, widget);
                sz.setHeight(qMax(sz.height(),
                                  mi->icon.actualSize(QSize(iconExtent, iconExtent)).height()
                                  + 2 * QWindowsStylePrivate::windowsItemFrame));
            }
            int maxpmw = mi->maxIconWidth;
            int tabSpacing = 20;
            if (mi->text.contains(u'\t'))
                w += tabSpacing;
            else if (mi->menuItemType == QStyleOptionMenuItem::SubMenu)
                w += 2 * QWindowsStylePrivate::windowsArrowHMargin;
            else if (mi->menuItemType == QStyleOptionMenuItem::DefaultItem) {
                // adjust the font and add the difference in size.
                // it would be better if the font could be adjusted in the initStyleOption qmenu func!!
                QFontMetrics fm(mi->font);
                QFont fontBold = mi->font;
                fontBold.setBold(true);
                QFontMetrics fmBold(fontBold);
                w += fmBold.horizontalAdvance(mi->text) - fm.horizontalAdvance(mi->text);
            }

            int checkcol = qMax<int>(maxpmw, QWindowsStylePrivate::windowsCheckMarkWidth); // Windows always shows a check column
            w += checkcol;
            w += int(QWindowsStylePrivate::windowsRightBorder) + 10;
            sz.setWidth(w);
        }
        break;
#endif // QT_CONFIG(menu)
#if QT_CONFIG(menubar)
    case CT_MenuBarItem:
        if (!sz.isEmpty())
            sz += QSize(QWindowsStylePrivate::windowsItemHMargin * 4, QWindowsStylePrivate::windowsItemVMargin * 2);
        break;
#endif
    case CT_ToolButton:
        if (qstyleoption_cast<const QStyleOptionToolButton *>(opt))
            return sz += QSize(7, 6);
        Q_FALLTHROUGH();

    default:
        sz = QCommonStyle::sizeFromContents(ct, opt, csz, widget);
    }
    return sz;
}